

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference filename_00;
  char *pcVar4;
  int *piVar5;
  ostream *poVar6;
  ssize_t sVar7;
  iterator iVar8;
  int error_2;
  int error_1;
  int write_result;
  int error;
  undefined1 local_a8 [4];
  int file_descriptor;
  string filename;
  void *pvStack_80;
  int size;
  char *data;
  string *relative_filename;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  undefined1 local_58 [8];
  iterator __end2;
  undefined1 local_38 [8];
  iterator __begin2;
  btree_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string *prefix_local;
  GeneratorContextImpl *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    bVar1 = anon_unknown_5::VerifyDirectoryExists(prefix);
    if (bVar1) {
      __begin2._8_8_ = &this->files_;
      iVar8 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
              ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
                       *)__begin2._8_8_);
      __end2._8_8_ = iVar8.node_;
      __begin2.node_._0_4_ = iVar8.position_;
      local_38 = (undefined1  [8])__end2._8_8_;
      iVar8 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
              ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
                     *)__begin2._8_8_);
      local_58 = (undefined1  [8])iVar8.node_;
      __end2.node_._0_4_ = iVar8.position_;
      while (bVar1 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                     ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                   *)local_38,(iterator *)local_58), bVar1) {
        filename_00 = absl::lts_20250127::container_internal::
                      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                      ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                   *)local_38);
        pvStack_80 = (void *)std::__cxx11::string::data();
        filename.field_2._12_4_ = std::__cxx11::string::size();
        bVar1 = anon_unknown_5::TryCreateParentDirectory(prefix,&filename_00->first);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0158ddf8;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                       ,prefix,&filename_00->first);
        do {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iVar2 = open(pcVar4,0x241,0x1b6);
          bVar1 = false;
          if (iVar2 < 0) {
            piVar5 = __errno_location();
            bVar1 = *piVar5 == 4;
          }
        } while (bVar1);
        if (iVar2 < 0) {
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_a8);
          poVar6 = std::operator<<(poVar6,": ");
          pcVar4 = strerror(iVar2);
          std::operator<<(poVar6,pcVar4);
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
          for (; 0 < (int)filename.field_2._12_4_;
              filename.field_2._12_4_ = filename.field_2._12_4_ - iVar3) {
            do {
              sVar7 = write(iVar2,pvStack_80,(long)(int)filename.field_2._12_4_);
              iVar3 = (int)sVar7;
              bVar1 = false;
              if (iVar3 < 0) {
                piVar5 = __errno_location();
                bVar1 = *piVar5 == 4;
              }
            } while (bVar1);
            if (iVar3 < 1) {
              if (iVar3 < 0) {
                piVar5 = __errno_location();
                iVar2 = *piVar5;
                poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_a8);
                poVar6 = std::operator<<(poVar6,": write: ");
                pcVar4 = strerror(iVar2);
                std::operator<<(poVar6,pcVar4);
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_a8);
                poVar6 = std::operator<<(poVar6,": write() returned zero?");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              }
              this_local._7_1_ = 0;
              bVar1 = true;
              goto LAB_0158ddca;
            }
            pvStack_80 = (void *)((long)pvStack_80 + (long)iVar3);
          }
          iVar2 = close(iVar2);
          if (iVar2 == 0) {
            bVar1 = false;
          }
          else {
            piVar5 = __errno_location();
            iVar2 = *piVar5;
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_a8);
            poVar6 = std::operator<<(poVar6,": close: ");
            pcVar4 = strerror(iVar2);
            std::operator<<(poVar6,pcVar4);
            this_local._7_1_ = 0;
            bVar1 = true;
          }
        }
LAB_0158ddca:
        std::__cxx11::string::~string((string *)local_a8);
        if (bVar1) goto LAB_0158ddf8;
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
        ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                      *)local_38);
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0158ddf8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const std::string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (const auto& pair : files_) {
    const std::string& relative_filename = pair.first;
    const char* data = pair.second.data();
    int size = pair.second.size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    std::string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
          open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}